

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void search_wiener(RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
                  RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  int16_t iVar1;
  int iVar2;
  int64_t iVar3;
  long in_RDX;
  int in_ESI;
  int *in_RDI;
  double dVar4;
  double dVar5;
  RestorationType rtype;
  double cost_wiener;
  double cost_none;
  int64_t bits_wiener;
  RestorationUnitInfo rui;
  AV1_COMMON *cm;
  int32_t hfilter [7];
  int32_t vfilter [7];
  int64_t H [2401];
  int64_t M [49];
  int reduced_wiener_win;
  int wiener_win;
  int prune_wiener;
  uint64_t src_var;
  int highbd;
  uint64_t thresh;
  int qs;
  int scale [3];
  int64_t bits_none;
  MACROBLOCK *x;
  RestUnitSearchInfo *rusi;
  RestSearchCtxt *rsc;
  aom_bit_depth_t in_stack_ffffffffffffb1a8;
  int in_stack_ffffffffffffb1ac;
  int in_stack_ffffffffffffb1b0;
  undefined4 in_stack_ffffffffffffb1b4;
  int iVar6;
  undefined4 in_stack_ffffffffffffb1bc;
  int in_stack_ffffffffffffb1c4;
  long local_4e18;
  int in_stack_ffffffffffffb1f4;
  int iVar7;
  undefined3 uVar8;
  uint in_stack_ffffffffffffb1f8;
  undefined4 in_stack_ffffffffffffb1fc;
  RestorationTileLimits *in_stack_ffffffffffffb200;
  RestSearchCtxt *in_stack_ffffffffffffb208;
  undefined4 local_4de8 [4];
  undefined8 local_4dd8;
  undefined8 local_4dd0;
  undefined8 local_4dc8;
  undefined8 local_4dc0;
  long local_4da0;
  int32_t local_4d98 [8];
  int32_t local_4d78 [8];
  int64_t local_4d58 [7];
  int16_t *in_stack_ffffffffffffb2e0;
  int16_t *in_stack_ffffffffffffb2e8;
  int64_t *in_stack_ffffffffffffb2f0;
  int64_t *in_stack_ffffffffffffb2f8;
  int in_stack_ffffffffffffb304;
  int32_t *in_stack_ffffffffffffb390;
  int32_t *in_stack_ffffffffffffb398;
  int64_t *in_stack_ffffffffffffb3a0;
  int64_t *in_stack_ffffffffffffb3a8;
  int in_stack_ffffffffffffb3b4;
  int64_t local_248 [50];
  int local_b4;
  int local_b0;
  undefined4 local_ac;
  uint64_t local_a8;
  uint local_9c;
  ulong local_98;
  int local_90;
  int local_8c [3];
  long local_80;
  long local_78;
  undefined8 *local_70;
  long local_68;
  int *local_38;
  
  local_70 = (undefined8 *)(*(long *)(in_RDX + 0x30) + (long)in_ESI * 0x40);
  local_78 = *(long *)(in_RDX + 0x18);
  local_80 = (long)*(int *)(local_78 + 0xb93c);
  local_68 = in_RDX;
  local_38 = in_RDI;
  if (*(int *)(*(long *)(in_RDX + 0x38) + 0x2c) != 0) {
    local_8c[0] = 0;
    local_8c[1] = 1;
    local_8c[2] = 2;
    iVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffb1b0,in_stack_ffffffffffffb1ac,
                             in_stack_ffffffffffffb1a8);
    local_90 = (int)iVar1 >> 3;
    local_98 = (ulong)(local_90 * local_90 * local_8c[*(int *)(*(long *)(local_68 + 0x38) + 0x2c)]
                      >> 4);
    local_9c = (uint)*(byte *)(*(long *)(*(long *)(local_68 + 0x10) + 0x6088) + 0x4c);
    local_a8 = var_restoration_unit
                         ((RestorationTileLimits *)
                          CONCAT44(in_stack_ffffffffffffb1b4,in_stack_ffffffffffffb1b0),
                          (YV12_BUFFER_CONFIG *)
                          CONCAT44(in_stack_ffffffffffffb1ac,in_stack_ffffffffffffb1a8),0,0x2be496);
    uVar8 = (undefined3)in_stack_ffffffffffffb1f8;
    in_stack_ffffffffffffb1f8 = CONCAT13(1,uVar8);
    if (local_98 <= local_a8) {
      in_stack_ffffffffffffb1f8 = CONCAT13(*(long *)(local_68 + 0x60) == 0,uVar8);
    }
    if (in_stack_ffffffffffffb1f8 >> 0x18 != 0) {
      *(long *)(local_68 + 0xa8) = local_80 + *(long *)(local_68 + 0xa8);
      *(long *)(local_68 + 0x88) = *(long *)(local_68 + 0x60) + *(long *)(local_68 + 0x88);
      *(undefined4 *)((long)local_70 + 0x2c) = 0;
      *(undefined8 *)(local_68 + 0x68) = 0x7fffffffffffffff;
      if (*(int *)(*(long *)(local_68 + 0x38) + 0x30) != 2) {
        return;
      }
      *(undefined1 *)(local_68 + 0x78) = 1;
      return;
    }
    local_ac = 0;
  }
  local_b0 = 5;
  if (*(int *)(local_68 + 0x20) == 0) {
    local_b0 = 7;
  }
  local_b4 = local_b0;
  if (*(int *)(*(long *)(local_68 + 0x38) + 0x34) != 0) {
    local_b4 = 5;
  }
  local_4da0 = *(long *)(local_68 + 0x10);
  if (*(char *)(*(long *)(local_4da0 + 0x6088) + 0x4c) == '\0') {
    iVar2 = local_38[2];
    iVar6 = local_38[3];
    (*av1_compute_stats)
              (local_b4,*(uint8_t **)(local_68 + 0x40),*(uint8_t **)(local_68 + 0x50),
               *(int16_t **)(local_68 + 0x120),*(int16_t **)(local_68 + 0x128),*local_38,local_38[1]
               ,iVar2,iVar6,*(int *)(local_68 + 0x48),*(int *)(local_68 + 0x58),local_248,local_4d58
               ,*(int *)(*(long *)(local_68 + 0x38) + 0x3c));
  }
  else {
    iVar2 = local_38[2];
    iVar6 = local_38[3];
    (*av1_compute_stats_highbd)
              (local_b4,*(uint8_t **)(local_68 + 0x40),*(uint8_t **)(local_68 + 0x50),
               *(int16_t **)(local_68 + 0x120),*(int16_t **)(local_68 + 0x128),*local_38,local_38[1]
               ,iVar2,iVar6,*(int *)(local_68 + 0x48),*(int *)(local_68 + 0x58),local_248,local_4d58
               ,*(aom_bit_depth_t *)(*(long *)(local_4da0 + 0x6088) + 0x48));
  }
  wiener_decompose_sep_sym
            (in_stack_ffffffffffffb3b4,in_stack_ffffffffffffb3a8,in_stack_ffffffffffffb3a0,
             in_stack_ffffffffffffb398,in_stack_ffffffffffffb390);
  memset(local_4de8,0,0x40);
  local_4de8[0] = 1;
  finalize_sym_filter(local_b4,local_4d78,(int16_t *)&local_4dd8);
  finalize_sym_filter(local_b4,local_4d98,(int16_t *)&local_4dc8);
  iVar3 = compute_score(in_stack_ffffffffffffb304,in_stack_ffffffffffffb2f8,
                        in_stack_ffffffffffffb2f0,in_stack_ffffffffffffb2e8,
                        in_stack_ffffffffffffb2e0);
  if (iVar3 < 1) {
    iVar3 = finer_search_wiener(in_stack_ffffffffffffb208,in_stack_ffffffffffffb200,
                                (RestorationUnitInfo *)
                                CONCAT44(in_stack_ffffffffffffb1fc,in_stack_ffffffffffffb1f8),
                                in_stack_ffffffffffffb1f4);
    *(int64_t *)(local_68 + 0x68) = iVar3;
    *local_70 = local_4dd8;
    local_70[1] = local_4dd0;
    local_70[2] = local_4dc8;
    local_70[3] = local_4dc0;
    iVar7 = *(int *)(local_78 + 0xb940);
    iVar2 = count_wiener_bits(in_stack_ffffffffffffb1c4,
                              (WienerInfo *)CONCAT44(in_stack_ffffffffffffb1bc,iVar6),
                              (WienerInfo *)CONCAT44(in_stack_ffffffffffffb1b4,iVar2));
    local_4e18 = (long)(iVar7 + iVar2 * 0x200);
    dVar4 = (double)(*(long *)(local_68 + 0x60) >>
                    (((char)*(undefined4 *)(*(long *)(*(long *)(local_68 + 0x10) + 0x6088) + 0x48) +
                     -8) * '\x02' & 0x3fU)) * 128.0 +
            ((double)(local_80 >> 4) * (double)*(int *)(local_78 + 0x4218)) / 512.0;
    dVar5 = (double)(*(long *)(local_68 + 0x68) >>
                    (((char)*(undefined4 *)(*(long *)(*(long *)(local_68 + 0x10) + 0x6088) + 0x48) +
                     -8) * '\x02' & 0x3fU)) * 128.0 +
            ((double)(local_4e18 >> 4) * (double)*(int *)(local_78 + 0x4218)) / 512.0;
    *(uint *)((long)local_70 + 0x2c) = (uint)(dVar5 < dVar4);
    if (*(int *)(*(long *)(local_68 + 0x38) + 0x30) == 1) {
      *(bool *)(local_68 + 0x78) = dVar4 * 1.01 < dVar5;
    }
    else if (*(int *)(*(long *)(local_68 + 0x38) + 0x30) == 2) {
      *(bool *)(local_68 + 0x78) = *(int *)((long)local_70 + 0x2c) == 0;
    }
    *(long *)(local_68 + 0x88) =
         *(long *)(local_68 + 0x60 + (ulong)(uint)(dVar5 < dVar4) * 8) + *(long *)(local_68 + 0x88);
    if (dVar4 <= dVar5) {
      local_4e18 = local_80;
    }
    *(long *)(local_68 + 0xa8) = local_4e18 + *(long *)(local_68 + 0xa8);
    if (dVar5 < dVar4) {
      *(undefined8 *)(local_68 + 0xc0) = *local_70;
      *(undefined8 *)(local_68 + 200) = local_70[1];
      *(undefined8 *)(local_68 + 0xd0) = local_70[2];
      *(undefined8 *)(local_68 + 0xd8) = local_70[3];
    }
  }
  else {
    *(long *)(local_68 + 0xa8) = local_80 + *(long *)(local_68 + 0xa8);
    *(long *)(local_68 + 0x88) = *(long *)(local_68 + 0x60) + *(long *)(local_68 + 0x88);
    *(undefined4 *)((long)local_70 + 0x2c) = 0;
    *(undefined8 *)(local_68 + 0x68) = 0x7fffffffffffffff;
    if (*(int *)(*(long *)(local_68 + 0x38) + 0x30) == 2) {
      *(undefined1 *)(local_68 + 0x78) = 1;
    }
  }
  return;
}

Assistant:

static inline void search_wiener(const RestorationTileLimits *limits,
                                 int rest_unit_idx, void *priv, int32_t *tmpbuf,
                                 RestorationLineBuffers *rlbs,
                                 struct aom_internal_error_info *error_info) {
  (void)tmpbuf;
  (void)rlbs;
  (void)error_info;
  RestSearchCtxt *rsc = (RestSearchCtxt *)priv;
  RestUnitSearchInfo *rusi = &rsc->rusi[rest_unit_idx];

  const MACROBLOCK *const x = rsc->x;
  const int64_t bits_none = x->mode_costs.wiener_restore_cost[0];

  // Skip Wiener search for low variance contents
  if (rsc->lpf_sf->prune_wiener_based_on_src_var) {
    const int scale[3] = { 0, 1, 2 };
    // Obtain the normalized Qscale
    const int qs = av1_dc_quant_QTX(rsc->cm->quant_params.base_qindex, 0,
                                    rsc->cm->seq_params->bit_depth) >>
                   3;
    // Derive threshold as sqr(normalized Qscale) * scale / 16,
    const uint64_t thresh =
        (qs * qs * scale[rsc->lpf_sf->prune_wiener_based_on_src_var]) >> 4;
    const int highbd = rsc->cm->seq_params->use_highbitdepth;
    const uint64_t src_var =
        var_restoration_unit(limits, rsc->src, rsc->plane, highbd);
    // Do not perform Wiener search if source variance is lower than threshold
    // or if the reconstruction error is zero
    int prune_wiener = (src_var < thresh) || (rsc->sse[RESTORE_NONE] == 0);
    if (prune_wiener) {
      rsc->total_bits[RESTORE_WIENER] += bits_none;
      rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
      rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
      rsc->sse[RESTORE_WIENER] = INT64_MAX;
      if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
      return;
    }
  }

  const int wiener_win =
      (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN : WIENER_WIN_CHROMA;

  int reduced_wiener_win = wiener_win;
  if (rsc->lpf_sf->reduce_wiener_window_size) {
    reduced_wiener_win =
        (rsc->plane == AOM_PLANE_Y) ? WIENER_WIN_REDUCED : WIENER_WIN_CHROMA;
  }

  int64_t M[WIENER_WIN2];
  int64_t H[WIENER_WIN2 * WIENER_WIN2];
  int32_t vfilter[WIENER_WIN], hfilter[WIENER_WIN];

#if CONFIG_AV1_HIGHBITDEPTH
  const AV1_COMMON *const cm = rsc->cm;
  if (cm->seq_params->use_highbitdepth) {
    // TODO(any) : Add support for use_downsampled_wiener_stats SF in HBD
    // functions. Optimize intrinsics of HBD design similar to LBD (i.e.,
    // pre-calculate d and s buffers and avoid most of the C operations).
    av1_compute_stats_highbd(reduced_wiener_win, rsc->dgd_buffer,
                             rsc->src_buffer, rsc->dgd_avg, rsc->src_avg,
                             limits->h_start, limits->h_end, limits->v_start,
                             limits->v_end, rsc->dgd_stride, rsc->src_stride, M,
                             H, cm->seq_params->bit_depth);
  } else {
    av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                      rsc->dgd_avg, rsc->src_avg, limits->h_start,
                      limits->h_end, limits->v_start, limits->v_end,
                      rsc->dgd_stride, rsc->src_stride, M, H,
                      rsc->lpf_sf->use_downsampled_wiener_stats);
  }
#else
  av1_compute_stats(reduced_wiener_win, rsc->dgd_buffer, rsc->src_buffer,
                    rsc->dgd_avg, rsc->src_avg, limits->h_start, limits->h_end,
                    limits->v_start, limits->v_end, rsc->dgd_stride,
                    rsc->src_stride, M, H,
                    rsc->lpf_sf->use_downsampled_wiener_stats);
#endif

  wiener_decompose_sep_sym(reduced_wiener_win, M, H, vfilter, hfilter);

  RestorationUnitInfo rui;
  memset(&rui, 0, sizeof(rui));
  rui.restoration_type = RESTORE_WIENER;
  finalize_sym_filter(reduced_wiener_win, vfilter, rui.wiener_info.vfilter);
  finalize_sym_filter(reduced_wiener_win, hfilter, rui.wiener_info.hfilter);

  // Filter score computes the value of the function x'*A*x - x'*b for the
  // learned filter and compares it against identity filer. If there is no
  // reduction in the function, the filter is reverted back to identity
  if (compute_score(reduced_wiener_win, M, H, rui.wiener_info.vfilter,
                    rui.wiener_info.hfilter) > 0) {
    rsc->total_bits[RESTORE_WIENER] += bits_none;
    rsc->total_sse[RESTORE_WIENER] += rsc->sse[RESTORE_NONE];
    rusi->best_rtype[RESTORE_WIENER - 1] = RESTORE_NONE;
    rsc->sse[RESTORE_WIENER] = INT64_MAX;
    if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) rsc->skip_sgr_eval = 1;
    return;
  }

  rsc->sse[RESTORE_WIENER] =
      finer_search_wiener(rsc, limits, &rui, reduced_wiener_win);
  rusi->wiener = rui.wiener_info;

  if (reduced_wiener_win != WIENER_WIN) {
    assert(rui.wiener_info.vfilter[0] == 0 &&
           rui.wiener_info.vfilter[WIENER_WIN - 1] == 0);
    assert(rui.wiener_info.hfilter[0] == 0 &&
           rui.wiener_info.hfilter[WIENER_WIN - 1] == 0);
  }

  const int64_t bits_wiener =
      x->mode_costs.wiener_restore_cost[1] +
      (count_wiener_bits(wiener_win, &rusi->wiener, &rsc->ref_wiener)
       << AV1_PROB_COST_SHIFT);

  double cost_none = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_none >> 4, rsc->sse[RESTORE_NONE],
      rsc->cm->seq_params->bit_depth);
  double cost_wiener = RDCOST_DBL_WITH_NATIVE_BD_DIST(
      x->rdmult, bits_wiener >> 4, rsc->sse[RESTORE_WIENER],
      rsc->cm->seq_params->bit_depth);

  RestorationType rtype =
      (cost_wiener < cost_none) ? RESTORE_WIENER : RESTORE_NONE;
  rusi->best_rtype[RESTORE_WIENER - 1] = rtype;

  // Set 'skip_sgr_eval' based on rdcost ratio of RESTORE_WIENER and
  // RESTORE_NONE or based on best_rtype
  if (rsc->lpf_sf->prune_sgr_based_on_wiener == 1) {
    rsc->skip_sgr_eval = cost_wiener > (1.01 * cost_none);
  } else if (rsc->lpf_sf->prune_sgr_based_on_wiener == 2) {
    rsc->skip_sgr_eval = rusi->best_rtype[RESTORE_WIENER - 1] == RESTORE_NONE;
  }

#if DEBUG_LR_COSTING
  // Store ref params for later checking
  lr_ref_params[RESTORE_WIENER][rsc->plane][rest_unit_idx].wiener_info =
      rsc->ref_wiener;
#endif  // DEBUG_LR_COSTING

  rsc->total_sse[RESTORE_WIENER] += rsc->sse[rtype];
  rsc->total_bits[RESTORE_WIENER] +=
      (cost_wiener < cost_none) ? bits_wiener : bits_none;
  if (cost_wiener < cost_none) rsc->ref_wiener = rusi->wiener;
}